

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool ox_buffer_write(buffer_s *self,char *data,size_t len)

{
  size_t sVar1;
  char *__dest;
  size_t sVar2;
  size_t left_len;
  _Bool write_ret;
  size_t len_local;
  char *data_local;
  buffer_s *self_local;
  
  left_len._7_1_ = true;
  sVar1 = ox_buffer_getwritevalidcount(self);
  if (sVar1 < len) {
    sVar1 = self->data_len;
    sVar2 = ox_buffer_getreadvalidcount(self);
    left_len._7_1_ = len <= sVar1 - sVar2;
    if (left_len._7_1_) {
      ox_buffer_adjustto_head(self);
      ox_buffer_write(self,data,len);
    }
  }
  else {
    __dest = ox_buffer_getwriteptr(self);
    memcpy(__dest,data,len);
    ox_buffer_addwritepos(self,len);
  }
  return left_len._7_1_;
}

Assistant:

bool 
ox_buffer_write(struct buffer_s* self, const char* data, size_t len)
{
    bool write_ret = true;

    if(ox_buffer_getwritevalidcount(self) >= len)
    {
        /*  直接写入    */
        memcpy(ox_buffer_getwriteptr(self), data, len);
        ox_buffer_addwritepos(self, len);
    }
    else
    {
        size_t left_len = self->data_len - ox_buffer_getreadvalidcount(self);
        if(left_len >= len)
        {
            ox_buffer_adjustto_head(self);
            ox_buffer_write(self, data, len);
        }
        else
        {
            write_ret = false;
        }
    }

    return write_ret;
}